

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  ulong uVar5;
  ulonglong uVar6;
  undefined8 extraout_RAX;
  int __oflag;
  char *pcVar7;
  tlc_error_t tVar8;
  char *__format;
  int iVar9;
  char *pcVar10;
  long lVar11;
  PARAMETERS params;
  tlc_linecount_t count;
  tlc_string_t errstr;
  CLineCount lc;
  PARAMETERS local_100;
  char *local_f0;
  ulong local_e8;
  tlc_linecount_t local_e0;
  tlc_string_t local_d8;
  CLineCount local_b8;
  
  local_100.buffersize = 0xffffffffffffffff;
  local_100.threadcount = -1;
  if (argc == 1) {
    main_cold_7();
    TURBOLINECOUNT::CLineCount::~CLineCount(&local_b8);
    _Unwind_Resume(extraout_RAX);
  }
  if (argc < 2) {
LAB_0010281a:
    main_cold_3();
LAB_001028c0:
    tVar8 = 1;
  }
  else {
    bVar2 = true;
    iVar9 = 1;
    pcVar10 = (char *)0x0;
    uVar5 = 0;
    do {
      while( true ) {
        local_e8 = uVar5;
        local_f0 = pcVar10;
        pcVar10 = argv[iVar9];
        cVar1 = *pcVar10;
        if (cVar1 != '-') break;
        if (((pcVar10[1] == 'h') && (pcVar10[2] == '\0')) ||
           (iVar3 = strcmp(pcVar10,"--help"), iVar3 == 0)) {
LAB_001028d4:
          main_cold_6();
LAB_001028dc:
          version();
          exit(0);
        }
        if (pcVar10[1] == 'v') {
          if (pcVar10[2] == '\0') goto LAB_001028dc;
          iVar3 = strcmp(pcVar10,"--version");
        }
        else {
          iVar3 = strcmp(pcVar10,"--version");
        }
        if (iVar3 == 0) goto LAB_001028dc;
        if (((pcVar10[1] == 'b') && (pcVar10[2] == '\0')) ||
           (iVar3 = strcmp(pcVar10,"--buffersize"), iVar3 == 0)) goto LAB_001026e9;
LAB_0010269b:
        if ((pcVar10[1] != 't') || (pcVar10[2] != '\0')) goto LAB_001026a9;
LAB_001026c0:
        if (iVar9 + 1 == argc) {
          pcVar7 = *argv;
          __format = "%s: Missing argument to %s\n";
          goto LAB_001028b6;
        }
        local_100.threadcount = atoi(argv[iVar9 + 1]);
        if (local_100.threadcount < 1) {
          main_cold_2();
          goto LAB_001028c0;
        }
LAB_00102779:
        iVar9 = iVar9 + 2;
        pcVar10 = local_f0;
        uVar5 = local_e8;
        if (argc <= iVar9) {
          if ((local_e8 & 1) == 0) goto LAB_0010281a;
          goto LAB_001027b3;
        }
      }
      iVar3 = strcmp(pcVar10,"--help");
      if (iVar3 == 0) goto LAB_001028d4;
      iVar3 = strcmp(pcVar10,"--version");
      if (iVar3 == 0) goto LAB_001028dc;
      iVar3 = strcmp(pcVar10,"--buffersize");
      if (iVar3 == 0) {
LAB_001026e9:
        if (iVar9 + 1 != argc) {
          pcVar10 = argv[iVar9 + 1];
          sVar4 = strlen(pcVar10);
          uVar5 = (ulong)((byte)pcVar10[sVar4 - 1] - 0x47);
          if ((byte)pcVar10[sVar4 - 1] - 0x47 < 0x27) {
            if ((0x100000001U >> (uVar5 & 0x3f) & 1) == 0) {
              lVar11 = 0x400;
              if ((0x1000000010U >> (uVar5 & 0x3f) & 1) == 0) {
                if ((0x4000000040U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_00102758;
                lVar11 = 0x100000;
              }
            }
            else {
              lVar11 = 0x40000000;
            }
          }
          else {
LAB_00102758:
            lVar11 = 1;
          }
          uVar6 = strtoull(pcVar10,(char **)&local_b8,10);
          local_100.buffersize = uVar6 * lVar11;
          goto LAB_00102779;
        }
        pcVar7 = *argv;
        __format = "%s: missing argument to %s\n";
LAB_001028b6:
        fprintf(_stderr,__format,pcVar7,pcVar10);
        goto LAB_001028c0;
      }
      if (cVar1 == '-') goto LAB_0010269b;
LAB_001026a9:
      iVar3 = strcmp(pcVar10,"--threadcount");
      if (iVar3 == 0) goto LAB_001026c0;
      if (!bVar2) {
        main_cold_1();
        goto LAB_001028c0;
      }
      iVar9 = iVar9 + 1;
      bVar2 = false;
      uVar5 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
    } while (iVar9 < argc);
LAB_001027b3:
    TURBOLINECOUNT::CLineCount::CLineCount(&local_b8,&local_100);
    iVar9 = TURBOLINECOUNT::CLineCount::open(&local_b8,pcVar10,__oflag);
    if ((char)iVar9 == '\0') {
      tVar8 = TURBOLINECOUNT::CLineCount::lastError(&local_b8);
      TURBOLINECOUNT::CLineCount::lastErrorString_abi_cxx11_(&local_d8,&local_b8);
      main_cold_4();
    }
    else {
      bVar2 = TURBOLINECOUNT::CLineCount::countLines(&local_b8,&local_e0);
      if (bVar2) {
        tVar8 = 0;
        printf("%ld\n",local_e0);
      }
      else {
        tVar8 = TURBOLINECOUNT::CLineCount::lastError(&local_b8);
        TURBOLINECOUNT::CLineCount::lastErrorString_abi_cxx11_(&local_d8,&local_b8);
        main_cold_5();
      }
    }
    TURBOLINECOUNT::CLineCount::~CLineCount(&local_b8);
  }
  return tVar8;
}

Assistant:

int main(int argc, char **argv)
#endif
{
	// Parse parameters
	int arg = 1;
	int posparam = 0;
	
	CLineCount::PARAMETERS params;
	params.buffersize = -1;
	params.threadcount = -1;

	TCHAR *filename = NULL;

	if(argc==1)
	{
		help(argv[0]);
		exit(0);
	}

	while (arg < argc)
	{
		if (_tcscmp(argv[arg], _T("-h")) == 0 || _tcscmp(argv[arg], _T("--help")) == 0) 
		{
			help(argv[0]);
			exit(0);
		}
		else if (_tcscmp(argv[arg], _T("-v")) == 0 || _tcscmp(argv[arg], _T("--version")) == 0) 
		{
			version();
			exit(0);
		}
		else if (_tcscmp(argv[arg], _T("-b")) == 0 || _tcscmp(argv[arg], _T("--buffersize")) == 0)
		{
			arg++;
			if (arg == argc)
			{
				_ftprintf(stderr, _T("%s: missing argument to %s\n"), argv[0], argv[arg-1]);
				return 1;
			}

			TCHAR *wsstr = argv[arg];

			// Check for size multipliers			
			size_t multiplier = 1;
			TCHAR *lastchar = wsstr + (_tcslen(wsstr) - 1);
			if (*lastchar == _T('k') || *lastchar == _T('K'))
			{
				multiplier = 1024;
				lastchar = 0;
			}
			else if (*lastchar == _T('m') || *lastchar == _T('M'))
			{
				multiplier = 1024 * 1024;
				lastchar = 0;
			}
			else if (*lastchar == _T('g') || *lastchar == _T('G'))
			{
				multiplier = 1024 * 1024 * 1024;
				lastchar = 0;
			}

			TCHAR *endptr;
			params.buffersize = ((size_t)_tcstoui64(argv[arg], &endptr, 10)) * multiplier;

		}
		else if (_tcscmp(argv[arg], _T("-t")) == 0 || _tcscmp(argv[arg], _T("--threadcount")) == 0)
		{
			arg++;
			if (arg == argc)
			{
				_ftprintf(stderr, _T("%s: Missing argument to %s\n"), argv[0], argv[arg-1]);
				return 1;
			}

			params.threadcount = _ttoi(argv[arg]);
			if(params.threadcount<=0)
			{
				_ftprintf(stderr, _T("%s: Invalid thread count\n"), argv[0]);
				return 1;
			}
		}
		else
		{
			if (posparam == 0)
			{
				filename = argv[arg];
			}
			else
			{
				_ftprintf(stderr, _T("%s: Too many arguments\n"), argv[0]);
				return 1;
			}
			posparam++;
		}

		arg++;
	}

	if (posparam != 1)
	{
		_ftprintf(stderr, _T("%s: Missing required argument\n"), argv[0]);
		return 1;
	}
	
	// Create line count class
	CLineCount lc(&params);

	if (!lc.open(filename))
	{
		tlc_error_t err = lc.lastError();
		tlc_string_t errstr = lc.lastErrorString();

		_ftprintf(stderr, _T("%s: Error %d (%s)\n"), argv[0], err, errstr.c_str());
		return err;
	}

	// Count lines
	tlc_linecount_t count;
	if (!lc.countLines(count))
	{
		tlc_error_t err = lc.lastError();
		tlc_string_t errstr = lc.lastErrorString();

		_ftprintf(stderr, _T("%s: Error %d: (%s)\n"), argv[0], err, errstr.c_str());
		return err;
	}

	// Display output
	_tprintf(_T(TLC_LINECOUNT_FMT) _T("\n"), count);
	
	return 0;
}